

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

TablePrinter * Catch::operator<<(TablePrinter *tp)

{
  char **ppcVar1;
  pointer pCVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  long lVar5;
  ostream *poVar6;
  int extraout_EDX;
  int extraout_EDX_00;
  int __oflag;
  StringRef *__file;
  char **ppcVar7;
  value_type colInfo;
  string padding;
  __string_type colStr;
  StringRef local_98;
  undefined8 local_78;
  char *local_70;
  long local_68;
  char local_60 [16];
  char *local_50;
  size_type sStack_48;
  char local_40 [16];
  
  __file = &local_98;
  ppcVar7 = &local_50;
  std::__cxx11::stringbuf::str();
  local_98.m_start = local_50;
  local_98.m_size = sStack_48;
  local_98.m_data = (char *)0x0;
  sVar4 = StringRef::numberOfCharacters(&local_98);
  ppcVar1 = &local_98.m_data;
  local_98.m_start = (char *)ppcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
  std::__cxx11::stringbuf::str((string *)&tp->field_0x28);
  __oflag = extraout_EDX;
  if ((char **)local_98.m_start != ppcVar1) {
    operator_delete(local_98.m_start);
    __oflag = extraout_EDX_00;
  }
  TablePrinter::open(tp,(char *)__file,__oflag);
  if (tp->m_currentColumn ==
      (int)((ulong)((long)(tp->m_columnInfos).
                          super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(tp->m_columnInfos).
                         super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333 + -1) {
    tp->m_currentColumn = -1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)tp->m_os,"\n",1);
  }
  lVar5 = (long)tp->m_currentColumn + 1;
  tp->m_currentColumn = (int)lVar5;
  pCVar2 = (tp->m_columnInfos).
           super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _Var3._M_p = pCVar2[lVar5].name._M_dataplus._M_p;
  local_98.m_start = (char *)ppcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,_Var3._M_p,_Var3._M_p + pCVar2[lVar5].name._M_string_length);
  local_78._0_4_ = pCVar2[lVar5].width;
  local_78._4_4_ = pCVar2[lVar5].justification;
  local_70 = local_60;
  lVar5 = (long)(int)(undefined4)local_78 - (sVar4 + 2);
  if ((ulong)(long)(int)(undefined4)local_78 < sVar4 + 2 || lVar5 == 0) {
    local_68 = 0;
    local_60[0] = '\0';
  }
  else {
    std::__cxx11::string::_M_construct((ulong)&local_70,(char)lVar5);
  }
  if (local_78._4_4_ == 0) {
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)tp->m_os,local_50,sStack_48);
    ppcVar7 = &local_70;
  }
  else {
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)tp->m_os,local_70,local_68);
  }
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,*ppcVar7,(long)ppcVar7[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if ((char **)local_98.m_start != ppcVar1) {
    operator_delete(local_98.m_start);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return tp;
}

Assistant:

TablePrinter& operator << (TablePrinter& tp, ColumnBreak) {
        auto colStr = tp.m_oss.str();
        // This takes account of utf8 encodings
        auto strSize = Catch::StringRef(colStr).numberOfCharacters();
        tp.m_oss.str("");
        tp.open();
        if (tp.m_currentColumn == static_cast<int>(tp.m_columnInfos.size() - 1)) {
            tp.m_currentColumn = -1;
            tp.m_os << "\n";
        }
        tp.m_currentColumn++;

        auto colInfo = tp.m_columnInfos[tp.m_currentColumn];
        auto padding = (strSize + 2 < static_cast<std::size_t>(colInfo.width))
            ? std::string(colInfo.width - (strSize + 2), ' ')
            : std::string();
        if (colInfo.justification == ColumnInfo::Left)
            tp.m_os << colStr << padding << " ";
        else
            tp.m_os << padding << colStr << " ";
        return tp;
    }